

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileImporter::countObjects
          (ObjFileImporter *this,
          vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_> *rObjects,
          int *iNumMeshes)

{
  pointer ppOVar1;
  Object *pOVar2;
  pointer ppOVar3;
  
  *iNumMeshes = 0;
  ppOVar3 = (rObjects->
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppOVar1 = (rObjects->
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar3 != ppOVar1) {
    *iNumMeshes = (int)((ulong)((long)ppOVar1 - (long)ppOVar3) >> 3);
    ppOVar3 = (rObjects->
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppOVar3 !=
        (rObjects->
        super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        pOVar2 = *ppOVar3;
        if ((pOVar2->m_SubObjects).
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pOVar2->m_SubObjects).
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          countObjects(this,&pOVar2->m_SubObjects,iNumMeshes);
        }
        ppOVar3 = ppOVar3 + 1;
      } while (ppOVar3 !=
               (rObjects->
               super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void ObjFileImporter::countObjects(const std::vector<ObjFile::Object*> &rObjects, int &iNumMeshes)
{
    iNumMeshes = 0;
    if ( rObjects.empty() )
        return;

    iNumMeshes += static_cast<unsigned int>( rObjects.size() );
    for (std::vector<ObjFile::Object*>::const_iterator it = rObjects.begin();
        it != rObjects.end();
        ++it)
    {
        if (!(*it)->m_SubObjects.empty())
        {
            countObjects((*it)->m_SubObjects, iNumMeshes);
        }
    }
}